

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

void __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this)

{
  TNamesDepend *__last;
  _List_node_base *p_Var1;
  
  if (this->m_pData != (char *)0x0) {
    operator_delete__(this->m_pData);
  }
  this->m_pData = (char *)0x0;
  this->m_uDataLen = 0;
  this->m_pFileComment = (char *)0x0;
  if ((this->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
    ::_M_erase_aux(&(this->m_data)._M_t,
                   (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (const_iterator)&(this->m_data)._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var1 = (this->m_strings).
           super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  __last = &this->m_strings;
  if (p_Var1 != (_List_node_base *)__last) {
    do {
      if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
        operator_delete__(p_Var1[1]._M_next);
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)__last);
    std::__cxx11::
    list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ::erase(__last,(__last->
                   super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                   )._M_impl._M_node.super__List_node_base._M_next,(const_iterator)__last);
    return;
  }
  return;
}

Assistant:

void CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::Reset() {
	// remove all data
	delete[] m_pData;
	m_pData = NULL;
	m_uDataLen = 0;
	m_pFileComment = NULL;
	if (!m_data.empty()) {
		m_data.erase(m_data.begin(), m_data.end());
	}

	// remove all strings
	if (!m_strings.empty()) {
		typename TNamesDepend::iterator i = m_strings.begin();
		for (; i != m_strings.end(); ++i) {
			delete[] const_cast<SI_CHAR *>(i->pItem);
		}
		m_strings.erase(m_strings.begin(), m_strings.end());
	}
}